

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  ulong uVar21;
  NodeRef *pNVar22;
  long lVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  uint uVar27;
  size_t sVar28;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  bool bVar30;
  vfloat_impl<4> __tmp_1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  undefined1 auVar34 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar35 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar37;
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  vint4 ai_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 ai_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai_2;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi_1;
  undefined1 auVar55 [16];
  vint4 bi_3;
  undefined1 auVar56 [16];
  vint4 bi_2;
  Precalculations pre;
  undefined1 local_3578 [16];
  vbool<4> valid_leaf;
  size_t local_34e8 [2];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar35 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar35 = vpcmpeqd_avx(auVar35,(undefined1  [16])valid_i->field_0);
    if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar35[0xf] < '\0')
    {
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar45);
      auVar53._8_4_ = 0x219392ef;
      auVar53._0_8_ = 0x219392ef219392ef;
      auVar53._12_4_ = 0x219392ef;
      auVar32 = vcmpps_avx(auVar32,auVar53,1);
      auVar3 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar53,auVar32);
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar45);
      auVar32 = vcmpps_avx(auVar32,auVar53,1);
      auVar4 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar53,auVar32);
      auVar32 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar45);
      auVar32 = vcmpps_avx(auVar32,auVar53,1);
      auVar32 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar53,auVar32);
      auVar45 = vrcpps_avx(auVar3);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = 0x3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar53 = vfnmadd213ps_fma(auVar3,auVar45,auVar38);
      auVar3 = vrcpps_avx(auVar4);
      auVar39 = vfnmadd213ps_fma(auVar4,auVar3,auVar38);
      auVar4 = vrcpps_avx(auVar32);
      auVar32 = vfnmadd213ps_fma(auVar32,auVar4,auVar38);
      auVar45 = vfmadd132ps_fma(auVar53,auVar45,auVar45);
      auVar53 = vfmadd132ps_fma(auVar39,auVar3,auVar3);
      auVar4 = vfmadd132ps_fma(auVar32,auVar4,auVar4);
      auVar32 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar3 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar32,auVar35);
      auVar32._8_4_ = 0xff800000;
      auVar32._0_8_ = 0xff800000ff800000;
      auVar32._12_4_ = 0xff800000;
      local_3578 = vblendvps_avx(auVar32,auVar3,auVar35);
      pNVar22 = stack_node + 2;
      fVar6 = *(float *)ray;
      fVar7 = *(float *)(ray + 4);
      fVar8 = *(float *)(ray + 8);
      fVar9 = *(float *)(ray + 0xc);
      paVar29 = &stack_near[2].field_0;
      fVar10 = *(float *)(ray + 0x10);
      fVar11 = *(float *)(ray + 0x14);
      fVar12 = *(float *)(ray + 0x18);
      fVar13 = *(float *)(ray + 0x1c);
      fVar14 = *(float *)(ray + 0x20);
      fVar15 = *(float *)(ray + 0x24);
      fVar16 = *(float *)(ray + 0x28);
      fVar17 = *(float *)(ray + 0x2c);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = aVar5;
LAB_0164aff5:
      sVar28 = pNVar22[-1].ptr;
      if (sVar28 != 0xfffffffffffffff8) {
        pNVar22 = pNVar22 + -1;
        paVar1 = paVar29 + -1;
        auVar31 = ZEXT1664((undefined1  [16])*paVar1);
        paVar29 = paVar29 + -1;
        auVar35 = vcmpps_avx((undefined1  [16])*paVar1,local_3578,1);
        if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar35[0xf] < '\0') {
          while( true ) {
            uVar27 = (uint)sVar28;
            if ((sVar28 & 8) != 0) break;
            uVar21 = sVar28 & 0xfffffffffffffff0;
            auVar34 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar20 = 0;
            sVar28 = 8;
            for (lVar23 = -0x20;
                (aVar33 = auVar34._0_16_, lVar23 != 0 &&
                (sVar25 = *(size_t *)(uVar21 + 0x40 + lVar23 * 2), sVar25 != 8));
                lVar23 = lVar23 + 4) {
              uVar2 = *(undefined4 *)(uVar21 + 0x120 + lVar23);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x60 + lVar23);
              auVar39._4_4_ = uVar2;
              auVar39._0_4_ = uVar2;
              auVar39._8_4_ = uVar2;
              auVar39._12_4_ = uVar2;
              auVar35 = *(undefined1 (*) [16])(ray + 0x70);
              auVar32 = vfmadd231ps_fma(auVar39,auVar35,auVar42);
              uVar2 = *(undefined4 *)(uVar21 + 0x160 + lVar23);
              auVar46._4_4_ = uVar2;
              auVar46._0_4_ = uVar2;
              auVar46._8_4_ = uVar2;
              auVar46._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0xa0 + lVar23);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar3 = vfmadd231ps_fma(auVar43,auVar35,auVar46);
              uVar2 = *(undefined4 *)(uVar21 + 0x1a0 + lVar23);
              auVar49._4_4_ = uVar2;
              auVar49._0_4_ = uVar2;
              auVar49._8_4_ = uVar2;
              auVar49._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0xe0 + lVar23);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar42 = vfmadd231ps_fma(auVar47,auVar35,auVar49);
              uVar2 = *(undefined4 *)(uVar21 + 0x140 + lVar23);
              auVar50._4_4_ = uVar2;
              auVar50._0_4_ = uVar2;
              auVar50._8_4_ = uVar2;
              auVar50._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x80 + lVar23);
              auVar54._4_4_ = uVar2;
              auVar54._0_4_ = uVar2;
              auVar54._8_4_ = uVar2;
              auVar54._12_4_ = uVar2;
              auVar43 = vfmadd231ps_fma(auVar54,auVar35,auVar50);
              uVar2 = *(undefined4 *)(uVar21 + 0x180 + lVar23);
              auVar51._4_4_ = uVar2;
              auVar51._0_4_ = uVar2;
              auVar51._8_4_ = uVar2;
              auVar51._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0xc0 + lVar23);
              auVar55._4_4_ = uVar2;
              auVar55._0_4_ = uVar2;
              auVar55._8_4_ = uVar2;
              auVar55._12_4_ = uVar2;
              auVar46 = vfmadd231ps_fma(auVar55,auVar35,auVar51);
              uVar2 = *(undefined4 *)(uVar21 + 0x1c0 + lVar23);
              auVar52._4_4_ = uVar2;
              auVar52._0_4_ = uVar2;
              auVar52._8_4_ = uVar2;
              auVar52._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar21 + 0x100 + lVar23);
              auVar56._4_4_ = uVar2;
              auVar56._0_4_ = uVar2;
              auVar56._8_4_ = uVar2;
              auVar56._12_4_ = uVar2;
              auVar47 = vfmadd231ps_fma(auVar56,auVar35,auVar52);
              auVar19._4_4_ = auVar45._4_4_ * -fVar7;
              auVar19._0_4_ = auVar45._0_4_ * -fVar6;
              auVar19._8_4_ = auVar45._8_4_ * -fVar8;
              auVar19._12_4_ = auVar45._12_4_ * -fVar9;
              auVar39 = vfmadd213ps_fma(auVar32,auVar45,auVar19);
              auVar18._4_4_ = auVar53._4_4_ * -fVar11;
              auVar18._0_4_ = auVar53._0_4_ * -fVar10;
              auVar18._8_4_ = auVar53._8_4_ * -fVar12;
              auVar18._12_4_ = auVar53._12_4_ * -fVar13;
              auVar38 = vfmadd213ps_fma(auVar3,auVar53,auVar18);
              auVar3._4_4_ = auVar4._4_4_ * -fVar15;
              auVar3._0_4_ = auVar4._0_4_ * -fVar14;
              auVar3._8_4_ = auVar4._8_4_ * -fVar16;
              auVar3._12_4_ = auVar4._12_4_ * -fVar17;
              auVar42 = vfmadd213ps_fma(auVar42,auVar4,auVar3);
              auVar43 = vfmadd213ps_fma(auVar43,auVar45,auVar19);
              auVar46 = vfmadd213ps_fma(auVar46,auVar53,auVar18);
              auVar47 = vfmadd213ps_fma(auVar47,auVar4,auVar3);
              auVar32 = vpminsd_avx(auVar39,auVar43);
              auVar3 = vpminsd_avx(auVar38,auVar46);
              auVar32 = vpmaxsd_avx(auVar32,auVar3);
              auVar3 = vpminsd_avx(auVar42,auVar47);
              auVar32 = vpmaxsd_avx(auVar32,auVar3);
              auVar3 = vpmaxsd_avx(auVar39,auVar43);
              auVar39 = vpmaxsd_avx(auVar38,auVar46);
              auVar39 = vpminsd_avx(auVar3,auVar39);
              auVar3 = vpmaxsd_avx(auVar42,auVar47);
              auVar3 = vpminsd_avx(auVar3,local_3578);
              auVar39 = vpminsd_avx(auVar39,auVar3);
              auVar3 = vpmaxsd_avx(auVar32,(undefined1  [16])aVar5);
              if ((uVar27 & 7) == 6) {
                auVar3 = vcmpps_avx(auVar3,auVar39,2);
                uVar2 = *(undefined4 *)(uVar21 + 0x1e0 + lVar23);
                auVar44._4_4_ = uVar2;
                auVar44._0_4_ = uVar2;
                auVar44._8_4_ = uVar2;
                auVar44._12_4_ = uVar2;
                auVar39 = vcmpps_avx(auVar44,auVar35,2);
                uVar2 = *(undefined4 *)(uVar21 + 0x200 + lVar23);
                auVar48._4_4_ = uVar2;
                auVar48._0_4_ = uVar2;
                auVar48._8_4_ = uVar2;
                auVar48._12_4_ = uVar2;
                auVar35 = vcmpps_avx(auVar35,auVar48,1);
                auVar35 = vandps_avx(auVar39,auVar35);
                auVar35 = vandps_avx(auVar35,auVar3);
              }
              else {
                auVar35 = vcmpps_avx(auVar3,auVar39,2);
              }
              auVar3 = vcmpps_avx(local_3578,auVar31._0_16_,6);
              auVar35 = vandps_avx(auVar35,auVar3);
              auVar35 = vpslld_avx(auVar35,0x1f);
              if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar35[0xf] < '\0') {
                auVar40._8_4_ = 0x7f800000;
                auVar40._0_8_ = 0x7f8000007f800000;
                auVar40._12_4_ = 0x7f800000;
                aVar41 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar40,auVar32,auVar35);
                auVar35 = vcmpps_avx((undefined1  [16])aVar41,(undefined1  [16])aVar33,1);
                sVar24 = sVar28;
                sVar26 = sVar25;
                aVar37 = aVar41;
                if (((((auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar35[0xf]) ||
                   (sVar24 = sVar25, sVar26 = sVar28, aVar37 = aVar33, aVar33 = aVar41, sVar28 != 8)
                   ) {
                  aVar41 = aVar33;
                  uVar20 = uVar20 + 1;
                  pNVar22->ptr = sVar26;
                  pNVar22 = pNVar22 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v = aVar37;
                  paVar29 = paVar29 + 1;
                  sVar25 = sVar24;
                }
                auVar34 = ZEXT1664((undefined1  [16])aVar41);
                sVar28 = sVar25;
              }
            }
            if (sVar28 == 8) goto LAB_0164aff5;
            auVar31 = ZEXT1664((undefined1  [16])aVar33);
            if (1 < uVar20) {
              aVar41 = paVar29[-2];
              aVar37 = paVar29[-1];
              auVar35 = vcmpps_avx((undefined1  [16])aVar41,(undefined1  [16])aVar37,1);
              aVar36 = aVar37;
              if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar35[0xf] < '\0') {
                paVar29[-2] = aVar37;
                paVar29[-1] = aVar41;
                auVar35 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar22 + -2) = auVar35;
                aVar36 = aVar41;
                aVar41 = aVar37;
              }
              auVar31 = ZEXT1664((undefined1  [16])aVar33);
              if (uVar20 != 2) {
                aVar37 = paVar29[-3];
                auVar35 = vcmpps_avx((undefined1  [16])aVar37,(undefined1  [16])aVar36,1);
                if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar35[0xf] < '\0') {
                  paVar29[-3] = aVar36;
                  paVar29[-1] = aVar37;
                  sVar25 = pNVar22[-3].ptr;
                  pNVar22[-3].ptr = pNVar22[-1].ptr;
                  pNVar22[-1].ptr = sVar25;
                  aVar37 = aVar36;
                }
                auVar35 = vcmpps_avx((undefined1  [16])aVar37,(undefined1  [16])aVar41,1);
                auVar31 = ZEXT1664((undefined1  [16])aVar33);
                if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar35[0xf] < '\0') {
                  paVar29[-3] = aVar41;
                  paVar29[-2] = aVar37;
                  auVar35 = vpermilps_avx(*(undefined1 (*) [16])(pNVar22 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar22 + -3) = auVar35;
                  auVar31 = ZEXT1664((undefined1  [16])aVar33);
                }
              }
            }
          }
          if (sVar28 == 0xfffffffffffffff8) {
            return;
          }
          valid_leaf.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
               vcmpps_avx(local_3578,auVar31._0_16_,6);
          if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0 ||
               ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
               (undefined1  [16])0x0) ||
              ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
            lVar23 = (ulong)(uVar27 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(sVar28 & 0xfffffffffffffff0);
            while (bVar30 = lVar23 != 0, lVar23 = lVar23 + -1, bVar30) {
              InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
              prim = prim + 1;
            }
            local_3578 = vblendvps_avx(local_3578,*(undefined1 (*) [16])(ray + 0x80),
                                       (undefined1  [16])valid_leaf.field_0);
          }
        }
        goto LAB_0164aff5;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }